

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

View<int,true,std::allocator<unsigned_long>> * __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
          (View<int,true,std::allocator<unsigned_long>> *this,StringStyle *style)

{
  allocator<unsigned_long> *paVar1;
  value_type vVar2;
  pointer puVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  reference piVar7;
  CoordinateOrder *pCVar8;
  pointer puVar9;
  iterator iVar10;
  char *pcVar11;
  reference pvVar12;
  reference piVar13;
  size_type sVar14;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  int *in_RDX;
  ulong local_2b8;
  size_t j_3;
  undefined1 local_2a8 [8];
  const_iterator it_1;
  undefined1 local_270 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  size_t j_2;
  size_t j_1;
  undefined1 local_240 [8];
  const_iterator it;
  undefined1 local_208 [4];
  unsigned_short q;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c2;
  undefined1 local_1e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c1;
  size_t x_1;
  size_t y_1;
  size_t x;
  size_t y;
  size_t j;
  ostringstream local_198 [8];
  ostringstream out;
  StringStyle *style_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
  std::__cxx11::ostringstream::ostringstream(local_198,_S_out);
  if (*in_RDX == 1) {
    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
    if (sVar5 == 0) {
      poVar6 = std::operator<<((ostream *)local_198,"A = ");
      piVar7 = operator()((View<int,true,std::allocator<unsigned_long>> *)style,0);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
      if (sVar5 == 1) {
        std::operator<<((ostream *)local_198,"A = (");
        for (y = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::size
                                      ((View<int,_true,_std::allocator<unsigned_long>_> *)style),
            y < sVar5; y = y + 1) {
          piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                             ((View<int,_true,_std::allocator<unsigned_long>_> *)style,y);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*piVar7);
          std::operator<<(poVar6,", ");
        }
        poVar6 = std::operator<<((ostream *)local_198,"\b\b)");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
        if (sVar5 == 2) {
          pCVar8 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                             ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
          if (*pCVar8 == FirstMajorOrder) {
            poVar6 = std::operator<<((ostream *)local_198,"A(r,c) =");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            for (x = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                          ((View<int,_true,_std::allocator<unsigned_long>_> *)style,
                                           0), x < sVar5; x = x + 1) {
              for (y_1 = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                              ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                               style,1), y_1 < sVar5; y_1 = y_1 + 1) {
                piVar7 = operator()((View<int,true,std::allocator<unsigned_long>> *)style,x,y_1);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*piVar7);
                std::operator<<(poVar6,' ');
              }
              std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)local_198,"A(c,r) =");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            for (x_1 = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape
                                            ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                             style,1), x_1 < sVar5; x_1 = x_1 + 1) {
              for (c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  puVar3 = c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                  puVar9 = (pointer)View<int,_true,_std::allocator<unsigned_long>_>::shape
                                              ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                               style,0), puVar3 < puVar9;
                  c1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)c1.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
                piVar7 = operator()((View<int,true,std::allocator<unsigned_long>> *)style,
                                    (size_t)c1.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,x_1);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*piVar7);
                std::operator<<(poVar6,' ');
              }
              std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
            }
          }
        }
        else {
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
          paVar1 = (allocator<unsigned_long> *)
                   ((long)&c2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<unsigned_long>::allocator(paVar1);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,sVar5,paVar1
                    );
          std::allocator<unsigned_long>::~allocator
                    ((allocator<unsigned_long> *)
                     ((long)&c2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
          paVar1 = (allocator<unsigned_long> *)
                   ((long)&it.coordinates_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<unsigned_long>::allocator(paVar1);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208,sVar5,paVar1
                    );
          std::allocator<unsigned_long>::~allocator
                    ((allocator<unsigned_long> *)
                     ((long)&it.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_2_ = 2;
          pCVar8 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                             ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
          if (*pCVar8 == FirstMajorOrder) {
            sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
            it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ =
                 (ushort)(byte)((char)sVar5 - 3);
          }
          View<int,_true,_std::allocator<unsigned_long>_>::begin
                    ((const_iterator *)local_240,
                     (View<int,_true,_std::allocator<unsigned_long>_> *)style);
          while (bVar4 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                                   ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240
                                   ), bVar4) {
            iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
            Iterator<int,true,std::allocator<unsigned_long>>::
            coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Iterator<int,true,std::allocator<unsigned_long>> *)local_240,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )iVar10._M_current);
            pcVar11 = Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240,
                                 (char *)iVar10._M_current,__c);
            __c_00 = extraout_EDX;
            if (pcVar11 == (char *)0x0) {
LAB_0011fd92:
              pcVar11 = Iterator<int,_true,_std::allocator<unsigned_long>_>::index
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240,
                                   (char *)iVar10._M_current,__c_00);
              if (pcVar11 != (char *)0x0) {
                poVar6 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)local_198,std::endl<char,std::char_traits<char>>);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
              pCVar8 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                                 ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
              if (*pCVar8 == FirstMajorOrder) {
                std::operator<<((ostream *)local_198,"A(");
                for (j_2 = 0; sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                                ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 style), j_2 < sVar5 - 2; j_2 = j_2 + 1) {
                  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_208,j_2);
                  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*pvVar12);
                  std::operator<<(poVar6,",");
                }
              }
              else {
                std::operator<<((ostream *)local_198,"A(c,r,");
                for (c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
                    puVar3 = c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                    puVar9 = (pointer)View<int,_true,_std::allocator<unsigned_long>_>::dimension
                                                ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                 style), puVar3 < puVar9;
                    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)((long)c.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
                  pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_208,
                                       (size_type)
                                       c.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*pvVar12);
                  std::operator<<(poVar6,",");
                }
              }
              std::operator<<((ostream *)local_198,'\b');
              pCVar8 = View<int,_true,_std::allocator<unsigned_long>_>::coordinateOrder
                                 ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
              if (*pCVar8 == FirstMajorOrder) {
                std::operator<<((ostream *)local_198,",r,c");
              }
              poVar6 = std::operator<<((ostream *)local_198,") =");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            else {
              pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_208,
                                   (ulong)it.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
              vVar2 = *pvVar12;
              iVar10._M_current =
                   (unsigned_long *)
                   (ulong)it.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_2_;
              pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_1e8,(size_type)iVar10._M_current);
              __c_00 = extraout_EDX_00;
              if (vVar2 != *pvVar12) goto LAB_0011fd92;
              pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_208,1);
              vVar2 = *pvVar12;
              pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_1e8,1);
              if (vVar2 != *pvVar12) {
                std::ostream::operator<<
                          ((ostream *)local_198,std::endl<char,std::char_traits<char>>);
              }
            }
            piVar13 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*piVar13);
            std::operator<<(poVar6," ");
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
            Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240);
          }
          Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_240);
          std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_208);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e8);
        }
      }
    }
    std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
  }
  else if (*in_RDX == 0) {
    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
    if (sVar5 == 0) {
      poVar6 = std::operator<<((ostream *)local_198,"A = ");
      piVar7 = operator()((View<int,true,std::allocator<unsigned_long>> *)style,0);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)style);
      paVar1 = (allocator<unsigned_long> *)
               ((long)&it_1.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_long>::allocator(paVar1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_270,sVar5,paVar1);
      std::allocator<unsigned_long>::~allocator
                ((allocator<unsigned_long> *)
                 ((long)&it_1.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      View<int,_true,_std::allocator<unsigned_long>_>::begin
                ((const_iterator *)local_2a8,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)style);
      while (bVar4 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                               ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8),
            bVar4) {
        std::operator<<((ostream *)local_198,"A(");
        iVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_270);
        Iterator<int,true,std::allocator<unsigned_long>>::
        coordinate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Iterator<int,true,std::allocator<unsigned_long>> *)local_2a8,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )iVar10._M_current);
        for (local_2b8 = 0;
            sVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_270),
            local_2b8 < sVar14; local_2b8 = local_2b8 + 1) {
          pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_270,
                               local_2b8);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_198,*pvVar12);
          std::operator<<(poVar6,',');
        }
        poVar6 = std::operator<<((ostream *)local_198,"\b) = ");
        piVar13 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar13);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
      }
      Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2a8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_270);
    }
    std::ostream::operator<<((ostream *)local_198,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

std::string 
View<T, isConst, A>::asString
(
    const StringStyle& style
) const
{
    testInvariant();
    std::ostringstream out(std::ostringstream::out);
    if(style == MatrixStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else if(dimension() == 1) {
            // vector
            out << "A = (";
            for(std::size_t j=0; j<this->size(); ++j) {
                out << (*this)(j) << ", ";
            }
            out << "\b\b)" << std::endl;
        }
        else if(dimension() == 2) {
            // matrix
            if(coordinateOrder() == FirstMajorOrder) {
                out << "A(r,c) =" << std::endl;
                for(std::size_t y=0; y<this->shape(0); ++y) {
                    for(std::size_t x=0; x<this->shape(1); ++x) {
                        out << (*this)(y, x) << ' ';
                    }
                    out << std::endl;
                }
            }
            else {
                out << "A(c,r) =" << std::endl;
                for(std::size_t y=0; y<this->shape(1); ++y) {
                    for(std::size_t x=0; x<this->shape(0); ++x) {
                        out << (*this)(x, y) << ' ';
                    }
                    out << std::endl;
                }
            }
        }
        else {
            // higher dimensional
            std::vector<std::size_t> c1(dimension());
            std::vector<std::size_t> c2(dimension());
            unsigned short q = 2;
            if(coordinateOrder() == FirstMajorOrder) {
                q = static_cast<unsigned char>(dimension() - 3);
            }
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                it.coordinate(c2.begin());
                if(it.index() == 0 || c2[q] != c1[q]) {
                    if(it.index() != 0) {
                        out << std::endl << std::endl;
                    }
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << "A(";
                        for(std::size_t j=0; j<dimension()-2; ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    else {
                        out << "A(c,r,";
                        for(std::size_t j=2; j<dimension(); ++j) {
                            out << c2[j] << ",";
                        }
                    }
                    out << '\b';
                    if(coordinateOrder() == FirstMajorOrder) {
                        out << ",r,c";
                    }
                    out << ") =" << std::endl;
                }
                else if(c2[1] != c1[1]) {
                    out << std::endl;
                }
                out << *it << " ";
                c1 = c2;
            }
            out << std::endl;
        }
        out << std::endl;
    }
    else if(style == TableStyle) {
        if(dimension() == 0) {
            // scalar
            out << "A = " << (*this)(0) << std::endl;
        }
        else {
            // non-scalar
            std::vector<std::size_t> c(dimension());
            for(const_iterator it = this->begin(); it.hasMore(); ++it) {
                out << "A(";
                it.coordinate(c.begin());
                for(std::size_t j=0; j<c.size(); ++j) {
                    out << c[j] << ',';
                }
                out << "\b) = " << *it << std::endl;
            }
        }
        out << std::endl;
    }
    return out.str();
}